

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

ExpressionSymbol * __thiscall Expression::parseSymbol(Expression *this)

{
  bool bVar1;
  int iVar2;
  ExpressionSymbol *this_00;
  ExpressionOperator *this_01;
  undefined4 extraout_var;
  ExpressionValue *pEVar3;
  CommandInfo *pCVar4;
  Variable *pVVar5;
  ExpressionValue *pEVar6;
  DataBuffer **ppDVar7;
  undefined4 extraout_var_00;
  DataBuffer *this_02;
  long lVar8;
  TokenInfo *pTVar9;
  void *__child_stack;
  void *__child_stack_00;
  __fn *__fn;
  BotscriptParser *pBVar10;
  void *in_R8;
  String local_2a8;
  int local_284;
  String local_280;
  int local_25c;
  uint local_258;
  Token local_254;
  undefined1 local_250 [4];
  Token tt;
  DataBuffer *local_230;
  DataBuffer *buf_1;
  DataBuffer *buf;
  Expression expr_1;
  String local_178;
  String local_158;
  String local_138;
  Variable *local_118;
  Variable *var;
  String local_108;
  CommandInfo *local_e8;
  CommandInfo *comm;
  Expression expr;
  OperatorInfo *op_1;
  OperatorInfo *__end1;
  OperatorInfo *__begin1;
  OperatorInfo (*__range1) [21];
  ExpressionValue *op;
  int pos;
  Expression *this_local;
  
  iVar2 = Lexer::position(this->m_lexer);
  bVar1 = Lexer::next(this->m_lexer,Colon);
  if (bVar1) {
    this_00 = (ExpressionSymbol *)operator_new(4);
    ExpressionColon::ExpressionColon((ExpressionColon *)this_00);
    return this_00;
  }
  for (__end1 = g_Operators; __end1 != (OperatorInfo *)"unknown identifier \'%1\'";
      __end1 = __end1 + 1) {
    expr.m_badTokenText._24_8_ = __end1;
    bVar1 = Lexer::next(this->m_lexer,__end1->token);
    if (bVar1) {
      this_01 = (ExpressionOperator *)operator_new(8);
      ExpressionOperator::ExpressionOperator
                (this_01,(ExpressionOperatorType)(expr.m_badTokenText._24_4_ - 0x1726b0 >> 4));
      return &this_01->super_ExpressionSymbol;
    }
  }
  bVar1 = Lexer::next(this->m_lexer,ParenStart);
  if (bVar1) {
    iVar2 = (int)(char)this->m_type;
    Expression((Expression *)&comm,this->m_parser,this->m_lexer,this->m_type);
    __fn = (__fn *)0x14;
    Lexer::mustGetNext(this->m_lexer,ParenEnd);
    pEVar3 = getResult((Expression *)&comm);
    iVar2 = ExpressionValue::clone(pEVar3,__fn,__child_stack,iVar2,in_R8);
    ~Expression((Expression *)&comm);
    return (ExpressionSymbol *)CONCAT44(extraout_var,iVar2);
  }
  pEVar3 = (ExpressionValue *)operator_new(0x18);
  ExpressionValue::ExpressionValue(pEVar3,this->m_type);
  Lexer::peekNextString(&local_108,this->m_lexer,1);
  pCVar4 = findCommandByName(&local_108);
  String::~String(&local_108);
  local_e8 = pCVar4;
  if (pCVar4 != (CommandInfo *)0x0) {
    Lexer::skip(this->m_lexer,1);
    if ((this->m_type != TYPE_Unknown) && (local_e8->returnvalue != this->m_type)) {
      error<String>("%1 returns an incompatible data type",&local_e8->name);
    }
    var = (Variable *)BotscriptParser::parseCommand(this->m_parser,local_e8);
    ExpressionValue::setBuffer(pEVar3,(DataBuffer **)&var);
    return &pEVar3->super_ExpressionSymbol;
  }
  bVar1 = Lexer::next(this->m_lexer,DollarSign);
  if (!bVar1) {
    switch(this->m_type) {
    case TYPE_Unknown:
    case TYPE_Void:
      getTokenString((String *)local_250,this);
      error<String>("unknown identifier `%1` (expected keyword, function or variable)",
                    (String *)local_250);
      String::~String((String *)local_250);
      break;
    case TYPE_Bool:
      bVar1 = Lexer::next(this->m_lexer,True);
      if ((bVar1) || (bVar1 = Lexer::next(this->m_lexer,False), bVar1)) {
        local_254 = Lexer::tokenType(this->m_lexer);
        local_258 = (uint)(local_254 == True);
        ExpressionValue::setValue(pEVar3,(int *)&local_258);
        return &pEVar3->super_ExpressionSymbol;
      }
    case TYPE_Int:
      bVar1 = Lexer::next(this->m_lexer,Number);
      if (bVar1) {
        getTokenString(&local_280,this);
        lVar8 = String::toLong(&local_280,(bool *)0x0,10);
        local_25c = (int)lVar8;
        ExpressionValue::setValue(pEVar3,&local_25c);
        String::~String(&local_280);
        return &pEVar3->super_ExpressionSymbol;
      }
    case TYPE_String:
      bVar1 = Lexer::next(this->m_lexer,String);
      if (bVar1) {
        getTokenString(&local_2a8,this);
        local_284 = getStringTableIndex(&local_2a8);
        ExpressionValue::setValue(pEVar3,&local_284);
        String::~String(&local_2a8);
        return &pEVar3->super_ExpressionSymbol;
      }
    }
    pTVar9 = Lexer::token(this->m_lexer);
    String::operator=(&this->m_badTokenText,&pTVar9->text);
    Lexer::setPosition(this->m_lexer,iVar2);
    if (pEVar3 != (ExpressionValue *)0x0) {
      ExpressionValue::~ExpressionValue(pEVar3);
      operator_delete(pEVar3);
    }
    return (ExpressionSymbol *)0x0;
  }
  Lexer::mustGetNext(this->m_lexer,Symbol);
  pBVar10 = this->m_parser;
  getTokenString(&local_138,this);
  pVVar5 = BotscriptParser::findVariable(pBVar10,&local_138);
  String::~String(&local_138);
  local_118 = pVVar5;
  if (pVVar5 == (Variable *)0x0) {
    getTokenString(&local_158,this);
    error<String>("unknown variable %1",&local_158);
    String::~String(&local_158);
  }
  if (local_118->type != this->m_type) {
    dataTypeName(&local_178,this->m_type);
    pVVar5 = local_118;
    dataTypeName((String *)&expr_1.m_badTokenText.field_0x18,local_118->type);
    error<String,String,String>
              ("expression requires %1, variable $%2 is of type %3",&local_178,&pVVar5->name,
               (String *)&expr_1.m_badTokenText.field_0x18);
    String::~String((String *)&expr_1.m_badTokenText.field_0x18);
    String::~String(&local_178);
  }
  if ((local_118->isarray & 1U) != 0) {
    Lexer::mustGetNext(this->m_lexer,BracketStart);
    pBVar10 = this->m_parser;
    iVar2 = 2;
    Expression((Expression *)&buf,pBVar10,this->m_lexer,TYPE_Int);
    pEVar6 = getResult((Expression *)&buf);
    ExpressionValue::convertToBuffer(pEVar6);
    pEVar6 = getResult((Expression *)&buf);
    ppDVar7 = ExpressionValue::buffer(pEVar6);
    iVar2 = DataBuffer::clone(*ppDVar7,(__fn *)pBVar10,__child_stack_00,iVar2,in_R8);
    buf_1 = (DataBuffer *)CONCAT44(extraout_var_00,iVar2);
    DataBuffer::writeHeader(buf_1,PushGlobalArray);
    DataBuffer::writeDWord(buf_1,local_118->index);
    ExpressionValue::setBuffer(pEVar3,&buf_1);
    Lexer::mustGetNext(this->m_lexer,BracketEnd);
    ~Expression((Expression *)&buf);
    return &pEVar3->super_ExpressionSymbol;
  }
  if (local_118->writelevel == WRITE_Constexpr) {
    ExpressionValue::setValue(pEVar3,&local_118->value);
    return &pEVar3->super_ExpressionSymbol;
  }
  this_02 = (DataBuffer *)operator_new(0xb8);
  DataBuffer::DataBuffer(this_02,8);
  local_230 = this_02;
  bVar1 = Variable::isGlobal(local_118);
  if (bVar1) {
    DataBuffer::writeHeader(local_230,PushGlobalVar);
  }
  else {
    DataBuffer::writeHeader(local_230,PushLocalVar);
  }
  DataBuffer::writeDWord(local_230,local_118->index);
  ExpressionValue::setBuffer(pEVar3,&local_230);
  return &pEVar3->super_ExpressionSymbol;
}

Assistant:

ExpressionSymbol* Expression::parseSymbol()
{
	int pos = m_lexer->position();
	ExpressionValue* op = null;

	if (m_lexer->next (Token::Colon))
		return new ExpressionColon;

	// Check for operator
	for (const OperatorInfo& op : g_Operators)
	{
		if (m_lexer->next (op.token))
			return new ExpressionOperator ((ExpressionOperatorType) (&op - &g_Operators[0]));
	}

	// Check sub-expression
	if (m_lexer->next (Token::ParenStart))
	{
		Expression expr (m_parser, m_lexer, m_type);
		m_lexer->mustGetNext (Token::ParenEnd);
		return expr.getResult()->clone();
	}

	op = new ExpressionValue (m_type);

	// Check function
	if (CommandInfo* comm = findCommandByName (m_lexer->peekNextString()))
	{
		m_lexer->skip();

		if (m_type != TYPE_Unknown and comm->returnvalue != m_type)
			error ("%1 returns an incompatible data type", comm->name);

		op->setBuffer (m_parser->parseCommand (comm));
		return op;
	}

	// Check for variables
	if (m_lexer->next (Token::DollarSign))
	{
		m_lexer->mustGetNext (Token::Symbol);
		Variable* var = m_parser->findVariable (getTokenString());

		if (var == null)
			error ("unknown variable %1", getTokenString());

		if (var->type != m_type)
		{
			error ("expression requires %1, variable $%2 is of type %3",
				dataTypeName (m_type), var->name, dataTypeName (var->type));
		}

		if (var->isarray)
		{
			m_lexer->mustGetNext (Token::BracketStart);
			Expression expr (m_parser, m_lexer, TYPE_Int);
			expr.getResult()->convertToBuffer();
			DataBuffer* buf = expr.getResult()->buffer()->clone();
			buf->writeHeader (DataHeader::PushGlobalArray);
			buf->writeDWord (var->index);
			op->setBuffer (buf);
			m_lexer->mustGetNext (Token::BracketEnd);
		}
		elif (var->writelevel == WRITE_Constexpr)
		{
			op->setValue (var->value);
		}
		else
		{
			DataBuffer* buf = new DataBuffer (8);

			if (var->isGlobal())
				buf->writeHeader (DataHeader::PushGlobalVar);
			else
				buf->writeHeader (DataHeader::PushLocalVar);

			buf->writeDWord (var->index);
			op->setBuffer (buf);
		}

		return op;
	}